

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__out_gif_code(stbi__gif *g,stbi__uint16 code)

{
  bool bVar1;
  int iVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  ushort in_SI;
  long in_RDI;
  int idx;
  stbi_uc *c;
  stbi_uc *p;
  undefined8 in_stack_ffffffffffffffe8;
  undefined6 in_stack_fffffffffffffff0;
  
  if (-1 < *(short *)(in_RDI + 0x834 + (ulong)in_SI * 4)) {
    stbi__out_gif_code((stbi__gif *)CONCAT26(in_SI,in_stack_fffffffffffffff0),
                       (stbi__uint16)((ulong)in_stack_ffffffffffffffe8 >> 0x30));
  }
  if (*(int *)(in_RDI + 0x8860) < *(int *)(in_RDI + 0x8858)) {
    iVar2 = *(int *)(in_RDI + 0x885c) + *(int *)(in_RDI + 0x8860);
    puVar3 = (undefined1 *)(*(long *)(in_RDI + 8) + (long)iVar2);
    *(undefined1 *)(*(long *)(in_RDI + 0x18) + (long)(iVar2 / 4)) = 1;
    puVar4 = (undefined1 *)
             (*(long *)(in_RDI + 0x8838) +
             (long)(int)((uint)*(byte *)(in_RDI + 0x837 + (ulong)in_SI * 4) << 2));
    if (0x80 < (byte)puVar4[3]) {
      *puVar3 = puVar4[2];
      puVar3[1] = puVar4[1];
      puVar3[2] = *puVar4;
      puVar3[3] = puVar4[3];
    }
    *(int *)(in_RDI + 0x885c) = *(int *)(in_RDI + 0x885c) + 4;
    if (*(int *)(in_RDI + 0x8854) <= *(int *)(in_RDI + 0x885c)) {
      *(undefined4 *)(in_RDI + 0x885c) = *(undefined4 *)(in_RDI + 0x884c);
      *(int *)(in_RDI + 0x8860) = *(int *)(in_RDI + 0x8844) + *(int *)(in_RDI + 0x8860);
      while( true ) {
        bVar1 = false;
        if (*(int *)(in_RDI + 0x8858) <= *(int *)(in_RDI + 0x8860)) {
          bVar1 = 0 < *(int *)(in_RDI + 0x8840);
        }
        if (!bVar1) break;
        *(int *)(in_RDI + 0x8844) =
             (1 << ((byte)*(undefined4 *)(in_RDI + 0x8840) & 0x1f)) * *(int *)(in_RDI + 0x8864);
        *(int *)(in_RDI + 0x8860) = *(int *)(in_RDI + 0x8850) + (*(int *)(in_RDI + 0x8844) >> 1);
        *(int *)(in_RDI + 0x8840) = *(int *)(in_RDI + 0x8840) + -1;
      }
    }
  }
  return;
}

Assistant:

static void stbi__out_gif_code(stbi__gif *g, stbi__uint16 code)
{
   stbi_uc *p, *c;
   int idx;

   // recurse to decode the prefixes, since the linked-list is backwards,
   // and working backwards through an interleaved image would be nasty
   if (g->codes[code].prefix >= 0)
      stbi__out_gif_code(g, g->codes[code].prefix);

   if (g->cur_y >= g->max_y) return;

   idx = g->cur_x + g->cur_y;
   p = &g->out[idx];
   g->history[idx / 4] = 1;

   c = &g->color_table[g->codes[code].suffix * 4];
   if (c[3] > 128) { // don't render transparent pixels;
      p[0] = c[2];
      p[1] = c[1];
      p[2] = c[0];
      p[3] = c[3];
   }
   g->cur_x += 4;

   if (g->cur_x >= g->max_x) {
      g->cur_x = g->start_x;
      g->cur_y += g->step;

      while (g->cur_y >= g->max_y && g->parse > 0) {
         g->step = (1 << g->parse) * g->line_size;
         g->cur_y = g->start_y + (g->step >> 1);
         --g->parse;
      }
   }
}